

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RhoR.cpp
# Opt level: O0

void __thiscall OpenMD::RhoR::writeRhoR(RhoR *this)

{
  byte bVar1;
  char *pcVar2;
  size_type sVar3;
  ostream *poVar4;
  reference pvVar5;
  undefined8 uVar6;
  long in_RDI;
  RealType r;
  uint i;
  ofstream rdfStream;
  uint local_218;
  ostream local_208 [520];
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_208,pcVar2,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    uVar6 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"RhoR: unable to open %s\n",uVar6);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::operator<<(local_208,"#radial density function rho(r)\n");
    std::operator<<(local_208,"#r\tcorrValue\n");
    for (local_218 = 0;
        sVar3 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x748)),
        local_218 < sVar3; local_218 = local_218 + 1) {
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (local_208,*(double *)(in_RDI + 0x720) * ((double)local_218 + 0.5));
      poVar4 = std::operator<<(poVar4,"\t");
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x748),
                          (ulong)local_218);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar5 / (double)*(int *)(in_RDI + 0xd0))
      ;
      std::operator<<(poVar4,"\n");
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void RhoR::writeRhoR() {
    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#radial density function rho(r)\n";
      rdfStream << "#r\tcorrValue\n";
      for (unsigned int i = 0; i < avgRhoR_.size(); ++i) {
        RealType r = deltaR_ * (i + 0.5);
        rdfStream << r << "\t" << avgRhoR_[i] / nProcessed_ << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RhoR: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }